

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionController_AddPegoutTxOut2_Test::TestBody
          (ConfidentialTransactionController_AddPegoutTxOut2_Test *this)

{
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  char *message;
  allocator local_764;
  allocator local_763;
  allocator local_762;
  allocator local_761;
  AssertionResult gtest_ar;
  AssertHelper local_738;
  undefined1 local_730;
  BlockHash local_718;
  vector local_6f8 [32];
  undefined8 local_6d8;
  undefined1 local_6d0;
  undefined1 local_6b8 [16];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_6a8;
  allocator local_690 [32];
  Privkey local_670;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_650;
  ConfidentialTransactionController txc;
  ConfidentialAssetId local_5e8 [9];
  ConfidentialTxOutReference local_470;
  ConfidentialTxOutReference local_378;
  ConfidentialTxOutReference local_280;
  ConfidentialTxInReference local_188;
  
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&txc,2,0);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&local_738);
  cfd::core::Txid::Txid((Txid *)local_5e8,(string *)&gtest_ar);
  cfd::ConfidentialTransactionController::AddTxIn((Txid *)&local_188,(uint)&txc,(uint)local_5e8);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_188);
  cfd::core::Txid::~Txid((Txid *)local_5e8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&local_738,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA",(allocator *)&local_670);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address((Address *)local_5e8,(string *)&local_738,local_6f8);
  local_6d8 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_6d0 = extraout_DL;
  std::__cxx11::string::string
            ((string *)&local_718,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,local_690);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)&local_718);
  cfd::ConfidentialTransactionController::AddTxOut((Address *)&local_280,(Amount *)&txc,local_5e8);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_280);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_718);
  cfd::core::Address::~Address((Address *)local_5e8);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_6f8);
  std::__cxx11::string::~string((string *)&local_738);
  local_6b8._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_6b8[8] = extraout_DL_00;
  std::__cxx11::string::string
            ((string *)&local_738,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_761);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)&local_738);
  std::__cxx11::string::string
            ((string *)local_6f8,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",
             &local_762);
  cfd::core::BlockHash::BlockHash(&local_718,(string *)local_6f8);
  std::__cxx11::string::string
            ((string *)&local_6d8,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",&local_763);
  cfd::core::Address::Address((Address *)local_5e8,(string *)&local_6d8);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_650);
  cfd::core::Privkey::Privkey(&local_670);
  message = "";
  std::__cxx11::string::string((string *)local_690,"",&local_764);
  cfd::core::ByteData::ByteData((ByteData *)&local_6a8);
  cfd::ConfidentialTransactionController::AddPegoutTxOut
            ((Amount *)&local_378,(ConfidentialAssetId *)&txc,(BlockHash *)local_6b8,
             (Address *)&gtest_ar,(NetType)&local_718,(Pubkey *)local_5e8,(Privkey *)0x0,
             (string *)&local_650,(uint)&local_670,(ByteData *)local_690,kMainnet,
             (Address *)&local_6a8);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_378);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_6a8);
  std::__cxx11::string::~string((string *)local_690);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_670);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_650);
  cfd::core::Address::~Address((Address *)local_5e8);
  std::__cxx11::string::~string((string *)&local_6d8);
  cfd::core::BlockHash::~BlockHash(&local_718);
  std::__cxx11::string::~string((string *)local_6f8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_738);
  local_738.data_ = (AssertHelperData *)cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_730 = extraout_DL_01;
  std::__cxx11::string::string
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&local_718);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(local_5e8,(string *)&gtest_ar);
  cfd::ConfidentialTransactionController::AddTxOutFee
            ((Amount *)&local_470,(ConfidentialAssetId *)&txc);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_470);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(local_5e8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,(char *)local_5e8[0]._vptr_ConfidentialAssetId,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  std::__cxx11::string::~string((string *)local_5e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_5e8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xf8,message);
    testing::internal::AssertHelper::operator=(&local_738,(Message *)local_5e8);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_5e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&txc);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut2)
{
    ConfidentialTransactionController txc(2, 0);
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"));
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");

}